

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcProcess::~IfcProcess(IfcProcess *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)&this->super_IfcObject = 0x908d98;
  *(undefined8 *)&(this->super_IfcObject).field_0xe0 = 0x908e10;
  *(undefined8 *)&(this->super_IfcObject).field_0x88 = 0x908dc0;
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x908de8;
  puVar2 = *(undefined1 **)
            &(this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
             field_0x10;
  puVar1 = &(this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
            field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  *(undefined8 *)&this->super_IfcObject = 0x908eb0;
  *(undefined8 *)&(this->super_IfcObject).field_0xe0 = 0x908ed8;
  puVar2 = *(undefined1 **)&(this->super_IfcObject).field_0x60;
  puVar1 = &(this->super_IfcObject).field_0x70;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcObject).field_0x38;
  puVar1 = &(this->super_IfcObject).field_0x48;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar1 = *(undefined1 **)&(this->super_IfcObject).field_0x10;
  puVar2 = &(this->super_IfcObject).field_0x20;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
    return;
  }
  return;
}

Assistant:

IfcProcess() : Object("IfcProcess") {}